

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

Promise<kj::String> __thiscall
kj::Promise<kj::String>::attach<kj::HttpClient::Response>
          (Promise<kj::String> *this,Response *attachments)

{
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *next;
  Response *params;
  NoInfer<kj::HttpClient::Response> *in_RDX;
  ExpandAndApplyResult<kj::_::MakeTupleFunc,_kj::HttpClient::Response> local_60;
  Own<kj::_::AttachmentPromiseNode<kj::HttpClient::Response>,_kj::_::PromiseDisposer> local_30;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_28;
  NoInfer<kj::HttpClient::Response> *local_20;
  Response *attachments_local;
  Promise<kj::String> *this_local;
  
  local_20 = in_RDX;
  attachments_local = attachments;
  this_local = this;
  next = mv<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>
                   ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)attachments);
  params = fwd<kj::HttpClient::Response>(local_20);
  tuple<kj::HttpClient::Response>(&local_60,params);
  kj::_::PromiseDisposer::
  appendPromise<kj::_::AttachmentPromiseNode<kj::HttpClient::Response>,kj::_::PromiseDisposer,kj::HttpClient::Response>
            ((PromiseDisposer *)&local_30,next,&local_60);
  Own<kj::_::PromiseNode,kj::_::PromiseDisposer>::
  Own<kj::_::AttachmentPromiseNode<kj::HttpClient::Response>,void>
            ((Own<kj::_::PromiseNode,kj::_::PromiseDisposer> *)&local_28,&local_30);
  Promise(this,false,(OwnPromiseNode *)&local_28);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::~Own(&local_28);
  Own<kj::_::AttachmentPromiseNode<kj::HttpClient::Response>,_kj::_::PromiseDisposer>::~Own
            (&local_30);
  HttpClient::Response::~Response(&local_60);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false,
      _::PromiseDisposer::appendPromise<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
          kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}